

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parser.c
# Opt level: O0

greatest_test_res
validate_instance(Instance *instance,int32_t expected_num_customers,int32_t expected_num_vehicles)

{
  _Bool _Var1;
  int local_24;
  int32_t i;
  int32_t expected_num_vehicles_local;
  int32_t expected_num_customers_local;
  Instance *instance_local;
  
  greatest_info.assertions = greatest_info.assertions + 1;
  _Var1 = is_valid_instance(instance);
  if (_Var1) {
    if (instance->num_customers == expected_num_customers) {
      if (instance->num_vehicles == expected_num_vehicles) {
        if (0.0 < instance->vehicle_cap) {
          if (instance->positions == (Vec2d *)0x0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
            ;
            greatest_info.fail_line = 0x2a;
            greatest_info.msg = "instance->positions";
            if ((greatest_info.flags & 4) != 0) {
              greatest_info.assertions = greatest_info.assertions + 4;
              abort();
            }
            instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
            greatest_info.assertions = greatest_info.assertions + 4;
          }
          else if (instance->demands == (double *)0x0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
            ;
            greatest_info.fail_line = 0x2b;
            greatest_info.msg = "instance->demands";
            if ((greatest_info.flags & 4) != 0) {
              greatest_info.assertions = greatest_info.assertions + 5;
              abort();
            }
            instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
            greatest_info.assertions = greatest_info.assertions + 5;
          }
          else if (instance->profits == (double *)0x0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
            ;
            greatest_info.fail_line = 0x2c;
            greatest_info.msg = "instance->profits";
            if ((greatest_info.flags & 4) != 0) {
              greatest_info.assertions = greatest_info.assertions + 6;
              abort();
            }
            instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
            greatest_info.assertions = greatest_info.assertions + 6;
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 7;
            if ((*instance->demands != 0.0) || (NAN(*instance->demands))) {
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
              ;
              greatest_info.fail_line = 0x2e;
              greatest_info.msg = "instance->demands[0] == 0.0";
              if ((greatest_info.flags & 4) != 0) {
                abort();
              }
              instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
            }
            else {
              for (local_24 = 1; local_24 < instance->num_customers + 1; local_24 = local_24 + 1) {
                greatest_info.assertions = greatest_info.assertions + 1;
                if (instance->demands[local_24] <= 0.0) {
                  greatest_info.fail_file =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
                  ;
                  greatest_info.fail_line = 0x30;
                  greatest_info.msg = "instance->demands[i] > 0.0";
                  if ((greatest_info.flags & 4) == 0) {
                    greatest_info.fail_line = 0x30;
                    greatest_info.fail_file =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
                    ;
                    greatest_info.msg = "instance->demands[i] > 0.0";
                    return GREATEST_TEST_RES_FAIL;
                  }
                  abort();
                }
              }
              greatest_info.msg = (char *)0x0;
              instance_local._4_4_ = GREATEST_TEST_RES_PASS;
            }
          }
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
          ;
          greatest_info.fail_line = 0x28;
          greatest_info.msg = "instance->vehicle_cap > 0";
          if ((greatest_info.flags & 4) != 0) {
            greatest_info.assertions = greatest_info.assertions + 3;
            abort();
          }
          instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
          greatest_info.assertions = greatest_info.assertions + 3;
        }
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
        ;
        greatest_info.fail_line = 0x27;
        greatest_info.msg = "instance->num_vehicles != expected_num_vehicles";
        if ((greatest_info.flags & 4) != 0) {
          greatest_info.assertions = greatest_info.assertions + 2;
          abort();
        }
        instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
        greatest_info.assertions = greatest_info.assertions + 2;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x26;
      greatest_info.msg = "instance->num_customers != expected_num_customers";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        abort();
      }
      instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 1;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
    ;
    greatest_info.fail_line = 0x25;
    greatest_info.msg = "is_valid_instance(instance)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    instance_local._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  return instance_local._4_4_;
}

Assistant:

TEST validate_instance(Instance *instance, int32_t expected_num_customers,
                       int32_t expected_num_vehicles) {
    ASSERT(is_valid_instance(instance));
    ASSERT_EQ(instance->num_customers, expected_num_customers);
    ASSERT_EQ(instance->num_vehicles, expected_num_vehicles);
    ASSERT(instance->vehicle_cap > 0);

    ASSERT(instance->positions);
    ASSERT(instance->demands);
    ASSERT(instance->profits);

    ASSERT(instance->demands[0] == 0.0);
    for (int32_t i = 1; i < instance->num_customers + 1; i++)
        ASSERT(instance->demands[i] > 0.0);

    // TODO: __EMAIL the professor__
    //       Double check these assertions. For some reason there are instances
    //       where the depot doesn't have a dual = 0, and some customers have
    //       duals which are negative. Therefore not all instances pass these
    //       checks. For this reason these checks are currently disabled
    if (0) {
        ASSERT(instance->profits[0] == 0.0);
        for (int32_t i = 1; i < instance->num_customers + 1; i++)
            ASSERT(instance->profits[i] >= 0.0);
    }

    PASS();
}